

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O2

void amrex::DistributionMapping::ComputeDistributionMappingEfficiency
               (DistributionMapping *dm,Vector<double,_std::allocator<double>_> *cost,
               Real *efficiency)

{
  uint uVar1;
  element_type *peVar2;
  pointer pdVar3;
  long lVar4;
  ulong uVar5;
  int i;
  long lVar6;
  int i_1;
  long lVar7;
  ulong uVar8;
  double *pdVar9;
  size_type __n;
  double dVar10;
  double dVar11;
  allocator_type local_81;
  Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  rankToCosts;
  Vector<double,_std::allocator<double>_> rankToCost;
  Vector<int,_std::allocator<int>_> cnt;
  
  uVar1 = *(uint *)(ParallelContext::frames + 0x10);
  __n = (size_type)(int)uVar1;
  std::
  vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  ::vector(&rankToCosts.
            super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
           ,__n,(allocator_type *)&cnt);
  std::vector<int,_std::allocator<int>_>::vector
            (&cnt.super_vector<int,_std::allocator<int>_>,__n,(allocator_type *)&rankToCost);
  peVar2 = (dm->m_ref).
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar6 = *(long *)&(peVar2->m_pmap).super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl;
  lVar4 = (long)*(pointer *)
                 ((long)&(peVar2->m_pmap).super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) - lVar6 >> 2;
  lVar7 = 0;
  if (lVar4 < 1) {
    lVar4 = lVar7;
  }
  for (; lVar4 != lVar7; lVar7 = lVar7 + 1) {
    cnt.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start[*(int *)(lVar6 + lVar7 * 4)] =
         cnt.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
         _M_impl.super__Vector_impl_data._M_start[*(int *)(lVar6 + lVar7 * 4)] + 1;
  }
  lVar4 = 0;
  for (lVar6 = 0;
      lVar6 < ((long)rankToCosts.
                     super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)rankToCosts.
                    super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18; lVar6 = lVar6 + 1) {
    std::vector<double,_std::allocator<double>_>::reserve
              ((vector<double,_std::allocator<double>_> *)
               ((long)&((rankToCosts.
                         super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<double,_std::allocator<double>_>).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar4),
               (long)cnt.super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[lVar6]);
    lVar4 = lVar4 + 0x18;
  }
  lVar4 = 0;
  for (lVar6 = 0;
      pdVar3 = (cost->super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start,
      lVar6 < (long)(cost->super_vector<double,_std::allocator<double>_>).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar3 >> 3; lVar6 = lVar6 + 1) {
    std::vector<double,_std::allocator<double>_>::push_back
              (&rankToCosts.
                super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                .
                super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start
                [*(int *)(*(long *)&(((dm->m_ref).
                                      super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl +
                         lVar6 * 4)].super_vector<double,_std::allocator<double>_>,
               (value_type_conflict2 *)((long)pdVar3 + lVar4));
    lVar4 = lVar4 + 8;
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&rankToCost.super_vector<double,_std::allocator<double>_>,__n,&local_81);
  uVar5 = 0;
  uVar8 = 0;
  if (0 < (int)uVar1) {
    uVar8 = (ulong)uVar1;
  }
  dVar10 = -1.0;
  for (; uVar5 != uVar8; uVar5 = uVar5 + 1) {
    dVar11 = 0.0;
    for (pdVar9 = rankToCosts.
                  super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar5].
                  super_vector<double,_std::allocator<double>_>.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar9 != rankToCosts.
                  super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar5].
                  super_vector<double,_std::allocator<double>_>.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish; pdVar9 = pdVar9 + 1) {
      dVar11 = dVar11 + *pdVar9;
    }
    rankToCost.super_vector<double,_std::allocator<double>_>.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [uVar5] = dVar11;
    if (dVar11 <= dVar10) {
      dVar11 = dVar10;
    }
    dVar10 = dVar11;
  }
  dVar11 = 0.0;
  for (; rankToCost.super_vector<double,_std::allocator<double>_>.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         rankToCost.super_vector<double,_std::allocator<double>_>.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
      rankToCost.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
           rankToCost.super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start + 1) {
    dVar11 = dVar11 + *rankToCost.super_vector<double,_std::allocator<double>_>.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
  }
  *efficiency = dVar11 / (dVar10 * (double)(int)uVar1);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&rankToCost);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&cnt);
  std::
  vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  ::~vector(&rankToCosts.
             super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
           );
  return;
}

Assistant:

void
DistributionMapping::ComputeDistributionMappingEfficiency (const DistributionMapping& dm,
                                                           const Vector<Real>& cost,
                                                           Real* efficiency)
{
    const int nprocs = ParallelDescriptor::NProcs();

    // This will store mapping from processor to the costs of FABs it controls,
    // (proc) --> ([cost_FAB_1, cost_FAB_2, ... ]),
    // for each proc
    Vector<Vector<Real>> rankToCosts(nprocs);

    // Count the number of costs belonging to each rank
    Vector<int> cnt(nprocs);
    for (int i=0; i<dm.size(); ++i)
    {
        ++cnt[dm[i]];
    }

    for (int i=0; i<rankToCosts.size(); ++i)
    {
        rankToCosts[i].reserve(cnt[i]);
    }

    for (int i=0; i<cost.size(); ++i)
    {
        rankToCosts[dm[i]].push_back(cost[i]);
    }

    Real maxCost = -1.0;

    // This will store mapping from (proc) --> (sum of cost) for each proc
    Vector<Real> rankToCost(nprocs);
    for (int i=0; i<nprocs; ++i)
    {
        const Real rwSum = std::accumulate(rankToCosts[i].begin(),
                                           rankToCosts[i].end(), 0.0_rt);
        rankToCost[i] = rwSum;
        maxCost = std::max(maxCost, rwSum);
    }

    // Write `efficiency` (number between 0 and 1), the mean cost per processor
    // (normalized to the max cost)
    *efficiency = (std::accumulate(rankToCost.begin(),
                                   rankToCost.end(), 0.0_rt) / (nprocs*maxCost));
}